

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editline.c
# Opt level: O0

void clear_line(void)

{
  int iVar1;
  size_t sVar2;
  undefined4 local_10;
  int k;
  int n;
  
  iVar1 = (rl_point + prompt_len) / tty_cols;
  sVar2 = strlen(rl_prompt);
  rl_point = -(int)sVar2;
  if (iVar1 < 1) {
    tty_put('\r');
  }
  else {
    for (local_10 = 0; local_10 < iVar1; local_10 = local_10 + 1) {
      tty_puts(line_up);
    }
    tty_put('\r');
  }
  ceol();
  rl_point = 0;
  rl_end = 0;
  *rl_line_buffer = '\0';
  return;
}

Assistant:

static void clear_line(void)
{
    int n = (rl_point + prompt_len) / tty_cols;
    rl_point = -(int)strlen(rl_prompt);

    if (n > 0) {
        for(int k = 0; k < n; k++)
            tty_puts(line_up);
        tty_put('\r');
    }
    else {
        tty_put('\r');
    }

    ceol();

    rl_point = 0;
    rl_end = 0;
    rl_line_buffer[0] = '\0';
}